

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shape.hpp
# Opt level: O2

void __thiscall OpenMD::Shape::~Shape(Shape *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

virtual ~Shape() = default;